

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ExpectedPrefixesCollector::ConsumeLine
          (ExpectedPrefixesCollector *this,StringPiece *line,string *out_error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_type sVar1;
  mapped_type *this_01;
  bool bVar2;
  string local_128;
  string local_108;
  undefined1 local_e8 [8];
  StringPiece prefix;
  StringPiece package;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int offset;
  string *out_error_local;
  StringPiece *line_local;
  ExpectedPrefixesCollector *this_local;
  
  psStack_28 = out_error;
  out_error_local = (string *)line;
  line_local = (StringPiece *)this;
  sVar1 = stringpiece_internal::StringPiece::find(line,'=',0);
  local_2c = (int)sVar1;
  bVar2 = local_2c != -1;
  if (bVar2) {
    join_0x00000010_0x00000000_ =
         stringpiece_internal::StringPiece::substr((StringPiece *)out_error_local,0,(long)local_2c);
    _local_e8 = stringpiece_internal::StringPiece::substr
                          ((StringPiece *)out_error_local,(long)(local_2c + 1),0xffffffffffffffff);
    TrimWhitespace((StringPiece *)&prefix.length_);
    TrimWhitespace((StringPiece *)local_e8);
    MaybeUnQuote((StringPiece *)local_e8);
    stringpiece_internal::StringPiece::operator_cast_to_string(&local_108,(StringPiece *)local_e8);
    this_00 = this->prefix_map_;
    stringpiece_internal::StringPiece::operator_cast_to_string
              (&local_128,(StringPiece *)&prefix.length_);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&local_128);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"Expected prefixes file line without equal sign: \'",&local_91);
    stringpiece_internal::StringPiece::operator_cast_to_string
              ((string *)&package.length_,(StringPiece *)out_error_local);
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &package.length_);
    std::operator+(&local_50,&local_70,"\'.");
    std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&package.length_);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return bVar2;
}

Assistant:

bool ExpectedPrefixesCollector::ConsumeLine(
    const StringPiece& line, std::string* out_error) {
  int offset = line.find('=');
  if (offset == StringPiece::npos) {
    *out_error = std::string("Expected prefixes file line without equal sign: '") +
                 std::string(line) + "'.";
    return false;
  }
  StringPiece package = line.substr(0, offset);
  StringPiece prefix = line.substr(offset + 1);
  TrimWhitespace(&package);
  TrimWhitespace(&prefix);
  MaybeUnQuote(&prefix);
  // Don't really worry about error checking the package/prefix for
  // being valid.  Assume the file is validated when it is created/edited.
  (*prefix_map_)[std::string(package)] = std::string(prefix);
  return true;
}